

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall amrex::AmrLevel::CreateLevelDirectory(AmrLevel *this,string *dir)

{
  bool bVar1;
  AmrLevel *in_RSI;
  long in_RDI;
  string FullPath;
  string LevelDir;
  undefined1 in_stack_ffffffffffffff7b;
  mode_t in_stack_ffffffffffffff7c;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  string local_50 [8];
  string *in_stack_ffffffffffffffb8;
  string local_30 [8];
  string *in_stack_ffffffffffffffd8;
  string *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  LevelDirectoryNames(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      in_stack_ffffffffffffffd8);
  bVar1 = ParallelDescriptor::IOProcessor();
  if ((bVar1) &&
     (bVar1 = UtilCreateDirectory((string *)
                                  CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                                  in_stack_ffffffffffffff7c,(bool)in_stack_ffffffffffffff7b), !bVar1
     )) {
    CreateDirectoryFailed(in_stack_ffffffffffffffb8);
  }
  *(undefined1 *)(in_RDI + 0x210) = 1;
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
AmrLevel::CreateLevelDirectory (const std::string &dir)
{
    // Build directory to hold the MultiFabs in the StateData at this level.
    // The directory is relative the the directory containing the Header file.

    std::string LevelDir, FullPath;
    LevelDirectoryNames(dir, LevelDir, FullPath);

    if(ParallelDescriptor::IOProcessor()) {
      if( ! amrex::UtilCreateDirectory(FullPath, 0755)) {
        amrex::CreateDirectoryFailed(FullPath);
      }
    }
    levelDirectoryCreated = true;
}